

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

string * __thiscall
t_xml_generator::number_to_string<long>(string *__return_storage_ptr__,t_xml_generator *this,long t)

{
  ostringstream out;
  locale alStack_198 [8];
  long local_190;
  undefined8 local_188 [46];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::locale::classic();
  std::ios::imbue(alStack_198);
  std::locale::~locale(alStack_198);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 0x12;
  std::ostream::_M_insert<long>((long)&local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

string number_to_string(T t) {
    std::ostringstream out;
    out.imbue(std::locale::classic());
    out.precision(std::numeric_limits<T>::digits10);
    out << t;
    return out.str();
  }